

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>::HDivDirectionsMaster
          (TPZGeoElRefLess<pzgeom::TPZQuadraticTetra> *this,TPZFMatrix<double> *directions)

{
  double *pdVar1;
  int i;
  TPZFNMatrix<9,_double> gradx;
  TPZFMatrix<double> *in_stack_00000658;
  TPZFMatrix<double> *in_stack_00000660;
  undefined4 in_stack_ffffffffffffff00;
  int iVar2;
  int64_t row;
  TPZFMatrix<double> *in_stack_ffffffffffffff10;
  double *in_stack_ffffffffffffff18;
  int64_t in_stack_ffffffffffffff20;
  int64_t in_stack_ffffffffffffff28;
  TPZFNMatrix<9,_double> *in_stack_ffffffffffffff30;
  
  row = 0;
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  for (iVar2 = 0; iVar2 < 3; iVar2 = iVar2 + 1) {
    pdVar1 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffff10,row,CONCAT44(iVar2,in_stack_ffffffffffffff00));
    *pdVar1 = 1.0;
  }
  pztopology::TPZTetrahedron::ComputeHDivDirections<double>(in_stack_00000660,in_stack_00000658);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1811337);
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::HDivDirectionsMaster(TPZFMatrix<REAL> &directions)
{
    TPZFNMatrix<9,REAL> gradx(3,TGeo::Dimension,0.);
    for (int i = 0; i < TGeo::Dimension; i++) {
        gradx(i,i) = 1.;
    }
    TGeo::ComputeHDivDirections(gradx, directions);
}